

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Singular.hpp
# Opt level: O0

bool mserialize::detail::singular_tuple(string_view full_tag,string_view tag,int max_recursion)

{
  string_view full_tag_00;
  bool bVar1;
  int in_stack_0000002c;
  undefined1 in_stack_00000030 [16];
  string_view elem_tag;
  string_view *in_stack_ffffffffffffffa0;
  string_view *tags;
  string_view local_40;
  string_view local_28 [2];
  
  string_view::remove_prefix(local_28,1);
  string_view::remove_suffix(local_28,1);
  local_40 = tag_pop(in_stack_ffffffffffffffa0);
  while( true ) {
    bVar1 = string_view::empty(&local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    full_tag_00._len._4_4_ = max_recursion;
    full_tag_00._0_12_ = stack0x00000040;
    tags = (string_view *)local_40._ptr;
    bVar1 = singular_impl(full_tag_00,(string_view)in_stack_00000030,in_stack_0000002c);
    if (!bVar1) break;
    local_40 = tag_pop(tags);
  }
  return false;
}

Assistant:

inline bool singular_tuple(string_view full_tag, string_view tag, int max_recursion)
{
  tag.remove_prefix(1); // drop (
  tag.remove_suffix(1); // drop )
  for (string_view elem_tag = tag_pop(tag); ! elem_tag.empty(); elem_tag = tag_pop(tag))
  {
    if (! singular_impl(full_tag, elem_tag, max_recursion)) { return false; }
  }
  return true;
}